

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_2dcf93::ForwardTemplateReference::hasFunctionSlow
          (ForwardTemplateReference *this,OutputStream *S)

{
  Cache CVar1;
  int iVar2;
  undefined1 uVar3;
  
  if (this->Printing == false) {
    this->Printing = true;
    CVar1 = this->Ref->FunctionCache;
    if (CVar1 == Unknown) {
      iVar2 = (*this->Ref->_vptr_Node[2])();
      uVar3 = (undefined1)iVar2;
    }
    else {
      uVar3 = CVar1 == Yes;
    }
    this->Printing = false;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

bool hasFunctionSlow(OutputStream &S) const override {
    if (Printing)
      return false;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    return Ref->hasFunction(S);
  }